

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_R_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Record_R_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Record_R_PDU *this)

{
  pointer pRVar1;
  KString *pKVar2;
  ostream *poVar3;
  ulong uVar4;
  KINT32 Value;
  ushort uVar5;
  pointer pRVar6;
  KStringStream ss;
  KString local_3a8;
  KString local_388;
  KString local_368;
  KString *local_348;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_((KString *)local_340,(Header7 *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-Record-R PDU-\n",0xf);
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_388,(Simulation_Management_Header *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tRequest ID:                ",0x1c);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  Reliability_Header::GetAsString_abi_cxx11_
            (&local_3a8,&(this->super_Set_Record_R_PDU).super_Reliability_Header);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_3a8._M_dataplus._M_p,local_3a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tEvent Type:                ",0x1c);
  DATA_TYPE::ENUMS::GetEnumAsStringEventType_abi_cxx11_
            (&local_368,(ENUMS *)(ulong)this->m_ui16EvntTyp,Value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)CONCAT71(local_368._M_dataplus._M_p._1_7_,
                                              (char)local_368._M_dataplus._M_p),
                      local_368._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tSerial Number:             ",0x1c);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tNumber Of record Sets:     ",0x1c);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_368._M_dataplus._M_p._1_7_,(char)local_368._M_dataplus._M_p) !=
      &local_368.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_368._M_dataplus._M_p._1_7_,(char)local_368._M_dataplus._M_p),
                    local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_348 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != &((KString *)local_340)->field_2) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  pRVar6 = (this->super_Set_Record_R_PDU).m_vRecs.
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->super_Set_Record_R_PDU).m_vRecs.
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar6 != pRVar1) {
    poVar3 = (ostream *)&((KString *)local_340)->field_2;
    do {
      (*(pRVar6->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_3a8,pRVar6);
      std::__cxx11::stringstream::stringstream((stringstream *)local_340);
      local_368._M_dataplus._M_p._0_1_ = '\t';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_368,1);
      if (local_3a8._M_string_length != 0) {
        uVar5 = 1;
        uVar4 = 0;
        do {
          local_368._M_dataplus._M_p._0_1_ = local_3a8._M_dataplus._M_p[uVar4];
          if ((local_3a8._M_string_length - 1 == uVar4) ||
             ((char)local_368._M_dataplus._M_p != '\n')) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_368,1);
          }
          else {
            local_368._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_368,1);
            local_368._M_dataplus._M_p._0_1_ = '\t';
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_368,1);
          }
          uVar4 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar4 < local_3a8._M_string_length);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
      std::ios_base::~ios_base(local_2c0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_388._M_dataplus._M_p,local_388._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar1);
  }
  pKVar2 = local_348;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString Record_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Record-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "\tRequest ID:                "   << m_ui32RqId
       << Reliability_Header::GetAsString()
       << "\tEvent Type:                "   << GetEnumAsStringEventType( m_ui16EvntTyp ) << "\n"
       << "\tSerial Number:             "   << m_ui32SrlNm    << "\n"
       << "\tNumber Of record Sets:     " << m_ui32NumRecSets  << "\n";

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}